

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

pair<unsigned_long,_short> __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>::_Pool::
Release(_Pool *this,
       Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
       *pNode)

{
  pair<unsigned_long,_short> *ppVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_> *in_RSI
  ;
  long in_RDI;
  pair<unsigned_long,_short> pVar3;
  pair<unsigned_long,_short> result;
  Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
  *local_20 [2];
  unsigned_long local_10;
  undefined8 local_8;
  
  local_20[0] = in_RSI;
  ppVar1 = Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
           ::value(in_RSI);
  local_10 = ppVar1->first;
  local_8 = *(undefined8 *)&ppVar1->second;
  std::
  swap<duckdb_skiplistlib::skip_list::Node<std::pair<unsigned_long,short>,duckdb::SkipLess<std::pair<unsigned_long,short>>>*>
            (local_20,(Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                       **)(in_RDI + 8));
  uVar2 = extraout_RDX;
  if (local_20[0] !=
      (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_> *)
      0x0) {
    ~Node((Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
           *)0x1d03cc0);
    operator_delete(local_20[0]);
    uVar2 = extraout_RDX_00;
  }
  pVar3._10_6_ = (undefined6)((ulong)uVar2 >> 0x10);
  pVar3.second = (undefined2)local_8;
  pVar3.first = local_10;
  return pVar3;
}

Assistant:

T Release(Node *pNode) {
			T result = pNode->value();
			std::swap(pNode, cache);
			delete pNode;
			return result;
		}